

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O2

sx__job_select_result sx__job_select(sx_job_context *ctx,uint32_t tid,uint32_t tags)

{
  sx__job **ppsVar1;
  sx_lock_t sVar2;
  uint32_t uVar3;
  sx__job *psVar4;
  sx__job *psVar5;
  sx__job *psVar6;
  uint uVar7;
  sx_job_t puVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  sx__job **ppsVar12;
  sx__job_select_result sVar13;
  
  while( true ) {
    LOCK();
    sVar2 = ctx->job_lk;
    ctx->job_lk = 1;
    UNLOCK();
    if (sVar2 == 0) break;
    do {
    } while (ctx->job_lk != 0);
  }
  bVar11 = true;
  uVar9 = 0;
  psVar6 = (sx__job *)0x0;
  do {
    if (!bVar11) {
      sVar13._8_8_ = uVar9 & 0xffffffff;
      sVar13.job = psVar6;
      return sVar13;
    }
    uVar10 = 0;
LAB_0010b71a:
    if ((uint)uVar10 < 3) {
      ppsVar1 = ctx->waiting_list + uVar10;
      ppsVar12 = ppsVar1;
      while (psVar4 = *ppsVar12, psVar4 != (sx__job *)0x0) {
        puVar8 = psVar4->wait_counter;
        if (*puVar8 == 0) {
          uVar3 = psVar4->owner_tid;
          puVar8 = (sx_job_t)(ulong)CONCAT31((int3)(uVar3 >> 8),uVar3 != tid);
          if ((uVar3 == 0 || uVar3 == tid) &&
             ((psVar4->tags == 0 ||
              (uVar7 = psVar4->tags & tags, puVar8 = (sx_job_t)(ulong)uVar7, uVar7 != 0)))) {
            psVar6 = psVar4->next;
            psVar5 = psVar4->prev;
            if (psVar5 != (sx__job *)0x0) {
              psVar5->next = psVar6;
            }
            if (psVar6 != (sx__job *)0x0) {
              psVar6->prev = psVar5;
            }
            if (*ppsVar1 == psVar4) {
              *ppsVar1 = psVar6;
            }
            if (ctx->waiting_list_last[uVar10] == psVar4) {
              ctx->waiting_list_last[uVar10] = psVar4->prev;
            }
            psVar4->next = (sx__job *)0x0;
            psVar4->prev = (sx__job *)0x0;
            uVar9 = CONCAT71((int7)((ulong)psVar5 >> 8),1);
            uVar10 = 4;
            psVar6 = psVar4;
            goto LAB_0010b71a;
          }
        }
        uVar9 = CONCAT71((int7)((ulong)puVar8 >> 8),1);
        ppsVar12 = &psVar4->next;
      }
      uVar10 = (ulong)((uint)uVar10 + 1);
      goto LAB_0010b71a;
    }
    ctx->job_lk = 0;
    bVar11 = false;
  } while( true );
}

Assistant:

static sx__job_select_result sx__job_select(sx_job_context* ctx, uint32_t tid, uint32_t tags)
{
    sx__job_select_result r = { 0 };
    
    sx_lock(ctx->job_lk) {
        for (int pr = 0; pr < SX_JOB_PRIORITY_COUNT; pr++) {
            sx__job* node = ctx->waiting_list[pr];
            while (node) {
                r.waiting_list_alive = true;
                if (*node->wait_counter == 0) {    // job must not be waiting/depend on any jobs
                    if ((node->owner_tid == 0 || node->owner_tid == tid) &&
                        (node->tags == 0 || (node->tags & tags))) {
                        r.job = node;
                        sx__job_remove_list(&ctx->waiting_list[pr], &ctx->waiting_list_last[pr], node);
                        pr = SX_JOB_PRIORITY_COUNT; // break out of the outer loop
                        break;
                    }
                }
                node = node->next;
            }    // while(iterate nodes)
        }        // foreach(priority)
    } // lock

    return r;
}